

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sharpyuv.c
# Opt level: O0

void InterpolateTwoRows(fixed_y_t *best_y,fixed_t *prev_uv,fixed_t *cur_uv,fixed_t *next_uv,int w,
                       fixed_y_t *out1,fixed_y_t *out2,int rgb_bit_depth)

{
  fixed_y_t fVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int A;
  int16_t *in_RCX;
  int16_t *in_RDX;
  int16_t *in_RSI;
  long in_RDI;
  uint in_R8D;
  fixed_y_t *in_R9;
  int bit_depth;
  int k;
  int len;
  int uv_w;
  int in_stack_ffffffffffffffb8;
  int iVar5;
  fixed_y_t *local_30;
  int16_t *local_20;
  int16_t *local_18;
  int16_t *local_10;
  
  iVar2 = (int)in_R8D >> 1;
  iVar3 = (int)(in_R8D - 1) >> 1;
  iVar5 = 3;
  iVar4 = GetPrecisionShift(len);
  iVar4 = len + iVar4;
  local_30 = in_R9;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  while (A = iVar5 + -1, 0 < iVar5) {
    fVar1 = Filter2(A,iVar4,len,in_stack_ffffffffffffffb8);
    *local_30 = fVar1;
    fVar1 = Filter2(A,iVar4,len,in_stack_ffffffffffffffb8);
    *_bit_depth = fVar1;
    (*SharpYuvFilterRow)(local_18,local_10,iVar3,(uint16_t *)(in_RDI + 2),local_30 + 1,iVar4);
    (*SharpYuvFilterRow)
              (local_18,local_20,iVar3,(uint16_t *)(in_RDI + (long)(int)in_R8D * 2 + 2),
               _bit_depth + 1,iVar4);
    if ((in_R8D & 1) == 0) {
      fVar1 = Filter2(A,iVar4,len,in_stack_ffffffffffffffb8);
      local_30[(int)(in_R8D - 1)] = fVar1;
      fVar1 = Filter2(A,iVar4,len,in_stack_ffffffffffffffb8);
      _bit_depth[(int)(in_R8D - 1)] = fVar1;
    }
    local_30 = local_30 + (int)in_R8D;
    _bit_depth = _bit_depth + (int)in_R8D;
    local_10 = local_10 + iVar2;
    local_18 = local_18 + iVar2;
    local_20 = local_20 + iVar2;
    iVar5 = A;
  }
  return;
}

Assistant:

static void InterpolateTwoRows(const fixed_y_t* const best_y,
                               const fixed_t* prev_uv,
                               const fixed_t* cur_uv,
                               const fixed_t* next_uv,
                               int w,
                               fixed_y_t* out1,
                               fixed_y_t* out2,
                               int rgb_bit_depth) {
  const int uv_w = w >> 1;
  const int len = (w - 1) >> 1;   // length to filter
  int k = 3;
  const int bit_depth = rgb_bit_depth + GetPrecisionShift(rgb_bit_depth);
  while (k-- > 0) {   // process each R/G/B segments in turn
    // special boundary case for i==0
    out1[0] = Filter2(cur_uv[0], prev_uv[0], best_y[0], bit_depth);
    out2[0] = Filter2(cur_uv[0], next_uv[0], best_y[w], bit_depth);

    SharpYuvFilterRow(cur_uv, prev_uv, len, best_y + 0 + 1, out1 + 1,
                      bit_depth);
    SharpYuvFilterRow(cur_uv, next_uv, len, best_y + w + 1, out2 + 1,
                      bit_depth);

    // special boundary case for i == w - 1 when w is even
    if (!(w & 1)) {
      out1[w - 1] = Filter2(cur_uv[uv_w - 1], prev_uv[uv_w - 1],
                            best_y[w - 1 + 0], bit_depth);
      out2[w - 1] = Filter2(cur_uv[uv_w - 1], next_uv[uv_w - 1],
                            best_y[w - 1 + w], bit_depth);
    }
    out1 += w;
    out2 += w;
    prev_uv += uv_w;
    cur_uv  += uv_w;
    next_uv += uv_w;
  }
}